

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O3

Memory * LiteScript::Memory::Load(Memory *__return_storage_ptr__,istream *stream)

{
  pointer *pppTVar1;
  short *psVar2;
  iterator __position;
  int iVar3;
  uint *puVar4;
  char cVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  vector<LiteScript::Type_*,_std::allocator<LiteScript::Type_*>_> *pvVar12;
  ulong uVar13;
  ulong uVar14;
  Type **__args;
  int iVar15;
  int iVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  string str;
  undefined1 *local_60;
  undefined8 local_58;
  undefined1 local_50 [16];
  uint *local_40;
  vector<LiteScript::Type*,std::allocator<LiteScript::Type*>> *local_38;
  
  __return_storage_ptr__->first_nfull = 0;
  *(undefined8 *)&__return_storage_ptr__->count = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->type_list).
           super__Vector_base<LiteScript::Type_*,_std::allocator<LiteScript::Type_*>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  (__return_storage_ptr__->type_list).
  super__Vector_base<LiteScript::Type_*,_std::allocator<LiteScript::Type_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->type_list).
  super__Vector_base<LiteScript::Type_*,_std::allocator<LiteScript::Type_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->Count = &__return_storage_ptr__->count;
  memset(__return_storage_ptr__,0,0x800);
  iVar9 = 6;
  iVar3 = 7;
  iVar15 = 4;
  iVar16 = 5;
  sVar17 = 2;
  sVar18 = 3;
  sVar19 = 0;
  sVar20 = 1;
  lVar11 = 0x400;
  do {
    auVar21._0_4_ = (int)sVar19;
    auVar21._4_4_ = (int)sVar20;
    auVar21._8_4_ = (int)sVar17;
    auVar21._12_4_ = (int)sVar18;
    auVar22._4_4_ = iVar16 * 0x10000 >> 0x10;
    auVar22._0_4_ = iVar15 * 0x10000 >> 0x10;
    auVar22._8_4_ = iVar9 * 0x10000 >> 0x10;
    auVar22._12_4_ = iVar3 * 0x10000 >> 0x10;
    auVar22 = packssdw(auVar21,auVar22);
    psVar2 = (short *)((long)(__return_storage_ptr__->arr)._M_elems + lVar11 * 2);
    *psVar2 = auVar22._0_2_ + 1;
    psVar2[1] = auVar22._2_2_ + 1;
    psVar2[2] = auVar22._4_2_ + 1;
    psVar2[3] = auVar22._6_2_ + 1;
    psVar2[4] = auVar22._8_2_ + 1;
    psVar2[5] = auVar22._10_2_ + 1;
    psVar2[6] = auVar22._12_2_ + 1;
    psVar2[7] = auVar22._14_2_ + 1;
    sVar19 = sVar19 + 8;
    sVar20 = sVar20 + 8;
    sVar17 = sVar17 + 8;
    sVar18 = sVar18 + 8;
    iVar15 = iVar15 + 8;
    iVar16 = iVar16 + 8;
    iVar9 = iVar9 + 8;
    iVar3 = iVar3 + 8;
    lVar11 = lVar11 + 8;
  } while (lVar11 != 0x500);
  pvVar12 = Type::GetTypesList();
  local_40 = &__return_storage_ptr__->count;
  uVar6 = std::istream::get();
  uVar7 = std::istream::get();
  uVar8 = std::istream::get();
  iVar9 = std::istream::get();
  uVar6 = (uVar8 & 0xff) << 0x10 | iVar9 << 0x18 | (uVar7 & 0xff) << 8 | uVar6 & 0xff;
  local_60 = local_50;
  local_58 = 0;
  local_50[0] = 0;
  if (uVar6 != 0) {
    local_38 = (vector<LiteScript::Type*,std::allocator<LiteScript::Type*>> *)
               &__return_storage_ptr__->type_list;
    uVar7 = 0;
    do {
      local_58 = 0;
      *local_60 = 0;
      while (cVar5 = std::istream::get(), cVar5 != '\0') {
        std::__cxx11::string::push_back((char)&local_60);
      }
      uVar13 = (long)(pvVar12->
                     super__Vector_base<LiteScript::Type_*,_std::allocator<LiteScript::Type_*>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(pvVar12->
                     super__Vector_base<LiteScript::Type_*,_std::allocator<LiteScript::Type_*>_>).
                     _M_impl.super__Vector_impl_data._M_start & 0x7fffffff8;
      if (uVar13 != 0) {
        uVar14 = 0;
        do {
          Type::GetName(*(Type **)((long)(pvVar12->
                                         super__Vector_base<LiteScript::Type_*,_std::allocator<LiteScript::Type_*>_>
                                         )._M_impl.super__Vector_impl_data._M_start + uVar14));
          iVar9 = std::__cxx11::string::compare((char *)&local_60);
          if (iVar9 == 0) {
            __args = (Type **)(uVar14 + (long)(pvVar12->
                                              super__Vector_base<LiteScript::Type_*,_std::allocator<LiteScript::Type_*>_>
                                              )._M_impl.super__Vector_impl_data._M_start);
            __position._M_current =
                 (__return_storage_ptr__->type_list).
                 super__Vector_base<LiteScript::Type_*,_std::allocator<LiteScript::Type_*>_>._M_impl
                 .super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (__return_storage_ptr__->type_list).
                super__Vector_base<LiteScript::Type_*,_std::allocator<LiteScript::Type_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<LiteScript::Type*,std::allocator<LiteScript::Type*>>::
              _M_realloc_insert<LiteScript::Type*const&>(local_38,__position,__args);
            }
            else {
              *__position._M_current = *__args;
              pppTVar1 = &(__return_storage_ptr__->type_list).
                          super__Vector_base<LiteScript::Type_*,_std::allocator<LiteScript::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              *pppTVar1 = *pppTVar1 + 1;
            }
            break;
          }
          uVar14 = uVar14 + 8;
        } while (uVar13 != uVar14);
      }
      if ((long)(__return_storage_ptr__->type_list).
                super__Vector_base<LiteScript::Type_*,_std::allocator<LiteScript::Type_*>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(__return_storage_ptr__->type_list).
                super__Vector_base<LiteScript::Type_*,_std::allocator<LiteScript::Type_*>_>._M_impl.
                super__Vector_impl_data._M_start >> 3 == (ulong)uVar7) {
        if (local_60 == local_50) {
          return __return_storage_ptr__;
        }
        operator_delete(local_60);
        return __return_storage_ptr__;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < uVar6);
  }
  uVar7 = std::istream::get();
  uVar8 = std::istream::get();
  uVar10 = std::istream::get();
  iVar9 = std::istream::get();
  puVar4 = local_40;
  uVar6 = *local_40;
  while (uVar6 < ((uVar10 & 0xff) << 0x10 | iVar9 << 0x18 | (uVar8 & 0xff) << 8 | uVar7 & 0xff)) {
    LoadVariable(__return_storage_ptr__,stream);
    uVar6 = *puVar4 + 1;
    *puVar4 = uVar6;
  }
  if (local_60 != local_50) {
    operator_delete(local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

LiteScript::Memory LiteScript::Memory::Load(std::istream &stream) {
    Memory memory;
    const std::vector<Type *>& types = Type::GetTypesList();
    unsigned int sz = IStreamer::Read<unsigned int>(stream);
    std::string str;
    unsigned char c;
    for (unsigned int i = 0; i < sz; i++) {
        str.clear();
        while ((c = (unsigned char)stream.get()) != 0)
            str += c;
        for (unsigned int j = 0, sz_j = types.size(); j < sz_j; j++) {
            if (str == types[j]->GetName()) {
                memory.type_list.push_back(types[j]);
                break;
            }
        }
        if (i == memory.type_list.size())
            return memory;
    }
    sz = IStreamer::Read<unsigned int>(stream);
    for (; memory.count < sz; memory.count++)
        memory.LoadVariable(stream);
    return memory;
}